

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O1

string * __thiscall
upb::generator::MiniTableHeaderFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view proto_filename,bool bootstrap)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  string_view filename;
  string_view fname;
  string base;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string local_40;
  
  pcVar4 = proto_filename._M_str;
  filename._M_str = (char *)proto_filename._M_len;
  local_58 = (char *)0x0;
  local_50 = 0;
  local_60 = &local_50;
  if ((int)proto_filename._M_str != 0) {
    filename._M_len = (size_t)filename._M_str;
    bVar2 = IsDescriptorProto(this,filename);
    pcVar4 = "upb_generator/stage1/";
    if (bVar2) {
      pcVar4 = "upb/reflection/stage1/";
    }
    std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,(ulong)pcVar4);
  }
  fname._M_str = pcVar4;
  fname._M_len = (size_t)filename._M_str;
  StripExtension_abi_cxx11_(&local_40,this,fname);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableHeaderFilename(absl::string_view proto_filename,
                                    bool bootstrap) {
  std::string base;
  if (bootstrap) {
    if (IsDescriptorProto(proto_filename)) {
      base = "upb/reflection/stage1/";
    } else {
      base = "upb_generator/stage1/";
    }
  }
  return base + StripExtension(proto_filename) + ".upb_minitable.h";
}